

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<1,_12,_12>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Vector<float,_3> *pVVar6;
  long lVar7;
  int col;
  undefined4 uVar8;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat4x3 m_1;
  Mat4x3 m;
  float afStack_d8 [6];
  float local_c0 [4];
  float local_b0 [2];
  ulong local_a8;
  undefined4 local_a0;
  Matrix<float,_3,_4> local_98;
  Matrix<float,_3,_4> local_68;
  Matrix<float,_3,_4> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_68;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_68.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_68.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_68.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_68.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_68.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    local_68.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar2 = (Vector<float,_3> *)&local_68;
    local_68.m_data.m_data[2].m_data[2] = 0.0;
    local_68.m_data.m_data[3].m_data[0] = 0.0;
    local_68.m_data.m_data[3].m_data[1] = 0.0;
    local_68.m_data.m_data[3].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    local_68.m_data.m_data[2].m_data[0] = 0.0;
    local_68.m_data.m_data[2].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    puVar4 = &s_constInMat4x3;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pVVar6 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar6->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar5 != 4);
      lVar3 = lVar3 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_98;
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar7 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar3 != lVar7) {
          uVar8 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar7) = uVar8;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x30);
      lVar5 = lVar5 + 1;
      pfVar1 = pfVar1 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar5 != 3);
    local_98.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_98.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_98.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_98.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_98.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_98.m_data.m_data[3].m_data._4_8_ = *(undefined8 *)(evalCtx->in[3].m_data + 1);
    local_98.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    local_98.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  }
  else {
    pVVar2 = (Vector<float,_3> *)&local_98;
    local_98.m_data.m_data[2].m_data[2] = 0.0;
    local_98.m_data.m_data[3].m_data[0] = 0.0;
    local_98.m_data.m_data[3].m_data[1] = 0.0;
    local_98.m_data.m_data[3].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[2] = 0.0;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[2] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    puVar4 = &DAT_01bf4660;
    lVar3 = 0;
    do {
      lVar5 = 0;
      pVVar6 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_4> *)pVVar6->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar5];
        lVar5 = lVar5 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar5 != 4);
      lVar3 = lVar3 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 4;
    } while (lVar3 != 3);
  }
  tcu::operator-(&local_38,&local_68,&local_98);
  local_c0[2] = 0.0;
  local_c0[0] = 0.0;
  local_c0[1] = 0.0;
  lVar3 = 0;
  do {
    local_c0[lVar3] =
         local_38.m_data.m_data[0].m_data[lVar3] + local_38.m_data.m_data[1].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a8 = local_a8 & 0xffffffff00000000;
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  lVar3 = 0;
  do {
    local_b0[lVar3] = local_c0[lVar3] + local_38.m_data.m_data[2].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  afStack_d8[4] = 0.0;
  afStack_d8[2] = 0.0;
  afStack_d8[3] = 0.0;
  lVar3 = 0;
  do {
    afStack_d8[lVar3 + 2] = local_b0[lVar3] + local_38.m_data.m_data[3].m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a8 = 0x100000000;
  local_a0 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_b0[lVar3]] = afStack_d8[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 - in1);
	}